

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

TokenType soul::HEARTOperator::Matcher::match(UTF8Reader *text)

{
  byte bVar1;
  bool bVar2;
  UnicodeChar UVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  UTF8Reader t;
  UTF8Reader local_38;
  
  pcVar6 = text->data;
  lVar4 = 0;
  pcVar5 = ";";
  local_38.data = pcVar6;
  do {
    if (lVar4 == 1) goto LAB_001eaf29;
    bVar1 = " ,./;"[lVar4 + 4];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  lVar4 = 0;
  pcVar5 = ".";
  local_38.data = pcVar6;
  do {
    if (lVar4 == 1) goto LAB_001eaf29;
    bVar1 = "[json.exception."[lVar4 + 0xf];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  lVar4 = 0;
  pcVar5 = ",";
  local_38.data = pcVar6;
  do {
    if (lVar4 == 1) goto LAB_001eaf29;
    bVar1 = ","[lVar4];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  lVar4 = 0;
  pcVar5 = "(";
  local_38.data = pcVar6;
  do {
    if (lVar4 == 1) goto LAB_001eaf29;
    bVar1 = " ("[lVar4 + 1];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  lVar4 = 0;
  pcVar5 = ")";
  local_38.data = pcVar6;
  do {
    if (lVar4 == 1) goto LAB_001eaf29;
    bVar1 = "Ternary operator branches have different types ($Q0$ and $Q1$)"[lVar4 + 0x3d];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
  } while (UVar3 == bVar1);
  lVar4 = 0;
  pcVar5 = "{";
  local_38.data = pcVar6;
  while (lVar4 != 1) {
    bVar1 = "{"[lVar4];
    lVar4 = lVar4 + 1;
    UVar3 = UTF8Reader::getAndAdvance(&local_38);
    if (UVar3 != bVar1) {
      pcVar6 = "}";
      bVar2 = UTF8Reader::advanceIfStartsWith(text,"}");
      if (!bVar2) {
        pcVar6 = "[[";
        bVar2 = UTF8Reader::advanceIfStartsWith(text,"[[");
        if (!bVar2) {
          pcVar6 = "]]";
          bVar2 = UTF8Reader::advanceIfStartsWith(text,"]]");
          if (!bVar2) {
            pcVar6 = "[";
            bVar2 = UTF8Reader::advanceIfStartsWith(text,"[");
            if (!bVar2) {
              pcVar6 = "]";
              bVar2 = UTF8Reader::advanceIfStartsWith(text,"]");
              if (!bVar2) {
                pcVar6 = "::";
                bVar2 = UTF8Reader::advanceIfStartsWith(text,"::");
                if (!bVar2) {
                  pcVar6 = ":";
                  bVar2 = UTF8Reader::advanceIfStartsWith(text,":");
                  if (!bVar2) {
                    pcVar6 = "?";
                    bVar2 = UTF8Reader::advanceIfStartsWith(text,"?");
                    if (!bVar2) {
                      pcVar6 = "#";
                      bVar2 = UTF8Reader::advanceIfStartsWith(text,"#");
                      if (!bVar2) {
                        pcVar6 = "==";
                        bVar2 = UTF8Reader::advanceIfStartsWith(text,"==");
                        if (!bVar2) {
                          pcVar6 = "=";
                          bVar2 = UTF8Reader::advanceIfStartsWith(text,"=");
                          if (!bVar2) {
                            pcVar6 = "!=";
                            bVar2 = UTF8Reader::advanceIfStartsWith(text,"!=");
                            if (!bVar2) {
                              pcVar6 = "!";
                              bVar2 = UTF8Reader::advanceIfStartsWith(text,"!");
                              if (!bVar2) {
                                pcVar6 = "->";
                                bVar2 = UTF8Reader::advanceIfStartsWith(text,"->");
                                if (!bVar2) {
                                  pcVar6 = "-";
                                  bVar2 = UTF8Reader::advanceIfStartsWith(text,"-");
                                  if (!bVar2) {
                                    pcVar6 = "+";
                                    bVar2 = UTF8Reader::advanceIfStartsWith(text,"+");
                                    if (!bVar2) {
                                      pcVar6 = "*";
                                      bVar2 = UTF8Reader::advanceIfStartsWith(text,"*");
                                      if (!bVar2) {
                                        pcVar6 = "/";
                                        bVar2 = UTF8Reader::advanceIfStartsWith(text,"/");
                                        if (!bVar2) {
                                          pcVar6 = "%";
                                          bVar2 = UTF8Reader::advanceIfStartsWith(text,"%");
                                          if (!bVar2) {
                                            pcVar6 = "^";
                                            bVar2 = UTF8Reader::advanceIfStartsWith(text,"^");
                                            if (!bVar2) {
                                              pcVar6 = "~";
                                              bVar2 = UTF8Reader::advanceIfStartsWith(text,"~");
                                              if (!bVar2) {
                                                pcVar6 = "&&";
                                                bVar2 = UTF8Reader::advanceIfStartsWith(text,"&&");
                                                if (!bVar2) {
                                                  pcVar6 = "&";
                                                  bVar2 = UTF8Reader::advanceIfStartsWith(text,"&");
                                                  if (!bVar2) {
                                                    pcVar6 = "||";
                                                    bVar2 = UTF8Reader::advanceIfStartsWith
                                                                      (text,"||");
                                                    if (!bVar2) {
                                                      pcVar6 = "|";
                                                      bVar2 = UTF8Reader::advanceIfStartsWith
                                                                        (text,"|");
                                                      if (!bVar2) {
                                                        pcVar6 = "<<";
                                                        bVar2 = UTF8Reader::advanceIfStartsWith
                                                                          (text,"<<");
                                                        if (!bVar2) {
                                                          pcVar6 = "<=";
                                                          bVar2 = UTF8Reader::advanceIfStartsWith
                                                                            (text,"<=");
                                                          if (!bVar2) {
                                                            pcVar6 = "<-";
                                                            bVar2 = UTF8Reader::advanceIfStartsWith
                                                                              (text,"<-");
                                                            if (!bVar2) {
                                                              pcVar6 = "<";
                                                              bVar2 = UTF8Reader::
                                                                      advanceIfStartsWith(text,"<");
                                                              if (!bVar2) {
                                                                pcVar6 = ">>>";
                                                                bVar2 = UTF8Reader::
                                                                        advanceIfStartsWith(text,
                                                  ">>>");
                                                  if (!bVar2) {
                                                    pcVar6 = ">>";
                                                    bVar2 = UTF8Reader::advanceIfStartsWith
                                                                      (text,">>");
                                                    if (!bVar2) {
                                                      pcVar6 = ">=";
                                                      bVar2 = UTF8Reader::advanceIfStartsWith
                                                                        (text,">=");
                                                      if (!bVar2) {
                                                        bVar2 = UTF8Reader::advanceIfStartsWith
                                                                          (text,">");
                                                        pcVar6 = (char *)0x0;
                                                        if (bVar2) {
                                                          pcVar6 = ">";
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      return (TokenType)pcVar6;
    }
  }
LAB_001eaf29:
  text->data = (char *)local_38;
  return (TokenType)pcVar5;
}

Assistant:

static TokenType match (UTF8Reader& text) noexcept
        {
            #define SOUL_COMPARE_OPERATOR(name, str) if (text.advanceIfStartsWith (str)) return name;
            SOUL_HEART_OPERATORS (SOUL_COMPARE_OPERATOR)
            #undef SOUL_COMPARE_OPERATOR
            return {};
        }